

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O1

int __thiscall branch_and_reduce_algorithm::packingReduction(branch_and_reduce_algorithm *this)

{
  int iVar1;
  pointer pvVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  int *piVar6;
  int *piVar7;
  bool bVar8;
  branch_and_reduce_algorithm *pbVar9;
  uint uVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var11;
  pointer piVar12;
  iterator __begin8;
  int *piVar13;
  pointer *ppiVar14;
  iterator __end8;
  long lVar15;
  int *piVar16;
  pointer pvVar17;
  int iVar18;
  int iVar19;
  vector<int,_std::allocator<int>_> *pvVar20;
  int iVar21;
  ulong uVar22;
  iterator iVar23;
  int iVar24;
  ulong uVar25;
  vector<int,std::allocator<int>> *pvVar26;
  uint uVar27;
  ulong uVar28;
  int *piVar29;
  long lVar30;
  vector<int,_std::allocator<int>_> copyOfTmp;
  vector<int,_std::allocator<int>_> x2;
  int local_f4;
  ulong local_f0;
  vector<int,_std::allocator<int>_> *local_e8;
  uint local_dc;
  ulong local_d8;
  ulong local_d0;
  int *local_c8;
  ulong local_c0;
  branch_and_reduce_algorithm *local_b8;
  int local_ac;
  int local_a8;
  int local_a4;
  string local_a0;
  vector<int,std::allocator<int>> *local_80;
  vector<int,std::allocator<int>> *local_78;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_70;
  vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
  *local_68;
  vector<int,_std::allocator<int>_> local_60;
  int *local_48;
  pointer *local_40;
  pointer *local_38;
  
  piVar29 = &this->rn;
  local_a8 = this->rn;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,&this->x);
  local_dc = 0;
  pvVar17 = (this->packing).
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->packing).
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar17) {
    local_68 = (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                *)&this->packing;
    local_38 = &(this->b_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_78 = (vector<int,std::allocator<int>> *)&this->b_vtcs;
    local_40 = &(this->packing_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_80 = (vector<int,std::allocator<int>> *)&this->packing_vtcs;
    local_70 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &this->packingCandidates;
    uVar28 = 0;
    iVar18 = -1;
    local_e8 = &this->x;
    local_b8 = this;
    local_48 = piVar29;
    do {
      if (iVar18 != *piVar29) {
        if (0 < this->N) {
          piVar12 = (local_e8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar15 = 0;
          do {
            local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar15] = piVar12[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar15 < this->N);
        }
        iVar18 = this->modifiedN + 1;
        lVar15 = (ulong)(uint)this->modifiedN << 4;
        while( true ) {
          iVar18 = iVar18 + -1;
          if (iVar18 < 1) break;
          (**(code **)(**(long **)((long)&(this->modifieds).
                                          super__Vector_base<std::shared_ptr<modified>,_std::allocator<std::shared_ptr<modified>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].
                                          super___shared_ptr<modified,_(__gnu_cxx::_Lock_policy)2>.
                                          _M_ptr + lVar15) + 0x18))();
          lVar15 = lVar15 + -0x10;
        }
        iVar18 = *piVar29;
      }
      pvVar17 = pvVar17 + uVar28;
      piVar12 = (pvVar17->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      local_f0 = (long)(pvVar17->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)piVar12;
      local_d8 = CONCAT44(local_d8._4_4_,*piVar12);
      local_d0 = 0;
      uVar28 = 0;
      local_a4 = iVar18;
      if (4 < local_f0) {
        uVar28 = 0;
        local_d0 = 0;
        uVar22 = 1;
        uVar25 = 2;
        do {
          pbVar9 = local_b8;
          iVar18 = piVar12[uVar22];
          iVar21 = iVar18;
          if (USE_DEPENDENCY_CHECKING == true) {
            local_c8 = (int *)CONCAT44(local_c8._4_4_,iVar18);
            pvVar2 = (local_b8->packingMap).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            _Var11 = std::
                     __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                               (pvVar2[iVar18].super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data._M_start,
                                *(pointer *)
                                 ((long)&pvVar2[iVar18].
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data + 8),&local_dc);
            iVar21 = (int)local_c8;
            if (_Var11._M_current ==
                *(pointer *)
                 ((long)&(pbVar9->packingMap).
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar18].
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data + 8)) {
              __assert_fail("!USE_DEPENDENCY_CHECKING || std::find(packingMap[v].begin(), packingMap[v].end(), pi) != packingMap[v].end()"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                            ,0x8e3,"int branch_and_reduce_algorithm::packingReduction()");
            }
          }
          if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[iVar18] < 0) {
            iVar24 = (int)local_d0;
            local_d0 = (ulong)(iVar24 + 1);
            (local_b8->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar24] = iVar21;
          }
          uVar28 = (ulong)((int)uVar28 +
                          (uint)(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[iVar18] == 1));
          piVar12 = (pvVar17->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          bVar8 = uVar25 < (ulong)((long)(pvVar17->super__Vector_base<int,_std::allocator<int>_>).
                                         _M_impl.super__Vector_impl_data._M_finish - (long)piVar12
                                  >> 2);
          uVar22 = uVar25;
          uVar25 = (ulong)((int)uVar25 + 1);
          this = local_b8;
        } while (bVar8);
      }
      uVar10 = (int)(local_f0 >> 2) + ~(uint)local_d8;
      local_f0 = (ulong)uVar10;
      uVar27 = (uint)uVar28;
      local_d8 = uVar28;
      if ((int)uVar10 < (int)uVar27) {
LAB_001122ce:
        uVar10 = 0xffffffff;
        goto LAB_001122d3;
      }
      iVar18 = (int)local_d0;
      if (iVar18 < 1 || uVar27 != uVar10) {
        if ((int)uVar10 < (int)(uVar27 + iVar18)) {
          if (iVar18 < 2) {
            __assert_fail("size >= 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                          ,0x924,"int branch_and_reduce_algorithm::packingReduction()");
          }
          iVar21 = (this->used).uid;
          (this->used).uid = iVar21 + 1;
          if (iVar21 < -1) {
            piVar12 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar15 = (long)(this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar12;
            if (lVar15 != 0) {
              uVar28 = 0;
              do {
                piVar12[uVar28] = 0;
                uVar28 = uVar28 + 1;
              } while ((uVar28 & 0xffffffff) < (ulong)(lVar15 >> 2));
            }
            (this->used).uid = 1;
          }
          piVar12 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar3 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar4 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar28 = 1;
          if (1 < iVar18) {
            uVar28 = local_d0 & 0xffffffff;
          }
          uVar22 = 0;
          do {
            piVar4[piVar12[uVar22]] = (this->used).uid;
            piVar3[piVar12[uVar22]] = -1;
            uVar22 = uVar22 + 1;
          } while (uVar28 != uVar22);
          pvVar17 = (this->adj).
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          iVar18 = *(this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar29 = pvVar17[iVar18].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_c8 = *(pointer *)
                      ((long)&pvVar17[iVar18].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data + 8);
          if (piVar29 != local_c8) {
            local_ac = uVar27 + 1;
            pvVar20 = local_e8;
            do {
              iVar18 = *piVar29;
              piVar12 = (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              if ((piVar12[iVar18] < 0) &&
                 (piVar3 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start, piVar3[iVar18] != (this->used).uid)) {
                pvVar17 = (this->adj).
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                piVar16 = pvVar17[iVar18].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                piVar6 = *(pointer *)
                          ((long)&pvVar17[iVar18].super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data + 8);
                if (piVar16 == piVar6) {
                  iVar21 = 0;
                }
                else {
                  piVar4 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  iVar21 = 0;
                  piVar13 = piVar16;
                  do {
                    if (piVar3[*piVar13] == (this->used).uid) {
                      iVar21 = iVar21 + 1;
                      piVar4[*piVar13] = 1;
                    }
                    piVar13 = piVar13 + 1;
                  } while (piVar13 != piVar6);
                }
                iVar24 = (int)local_d8 + iVar21;
                local_c0 = CONCAT44(local_c0._4_4_,iVar24);
                if ((int)local_f0 < iVar24) {
                  _Var11._M_current =
                       (this->que).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
                  *_Var11._M_current = 2;
                  if (piVar16 == piVar6) {
                    lVar15 = 1;
                  }
                  else {
                    iVar21 = 1;
                    do {
                      if (piVar12[*piVar16] < 0) {
                        lVar15 = (long)iVar21;
                        iVar21 = iVar21 + 1;
                        _Var11._M_current[lVar15] = *piVar16;
                      }
                      piVar16 = piVar16 + 1;
                    } while (piVar16 != piVar6);
                    lVar15 = (long)iVar21;
                  }
                  std::vector<int,std::allocator<int>>::
                  vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                            ((vector<int,std::allocator<int>> *)&local_a0,_Var11,
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                             (_Var11._M_current + lVar15),(allocator_type *)&local_f4);
                  std::
                  vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                  ::emplace_back<std::vector<int,std::allocator<int>>>
                            (local_68,(vector<int,_std::allocator<int>_> *)&local_a0);
                  if (USE_DEPENDENCY_CHECKING == true) {
                    pvVar17 = (this->packing).
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                    local_f4 = (int)((ulong)((long)pvVar17 -
                                            (long)(this->packing).
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                               -0x55555555 + -1;
                    piVar12 = pvVar17[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    if (4 < (ulong)((long)pvVar17[-1].super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_finish - (long)piVar12)
                       ) {
                      uVar22 = 1;
                      do {
                        pvVar26 = (vector<int,std::allocator<int>> *)
                                  ((this->packingMap).
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + piVar12[uVar22]);
                        iVar23._M_current = *(int **)(pvVar26 + 8);
                        if (iVar23._M_current == *(int **)(pvVar26 + 0x10)) {
                          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                    (pvVar26,iVar23,&local_f4);
                        }
                        else {
                          *iVar23._M_current = local_f4;
                          *(int **)(pvVar26 + 8) = iVar23._M_current + 1;
                        }
                        uVar22 = uVar22 + 1;
                        piVar12 = pvVar17[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start;
                      } while (uVar22 < (ulong)((long)pvVar17[-1].
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_finish -
                                                (long)piVar12 >> 2));
                    }
                    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                    _M_emplace_unique<int&>(local_70,&local_f4);
                    pvVar20 = local_e8;
                  }
                  set(this,iVar18,1);
                  if (local_a0._M_dataplus._M_p != (pointer)0x0) {
                    operator_delete(local_a0._M_dataplus._M_p,
                                    local_a0.field_2._M_allocated_capacity -
                                    (long)local_a0._M_dataplus._M_p);
                  }
                  iVar18 = 0x23;
                }
                else {
                  iVar18 = 0;
                  if ((((uint)BRANCHING < 0x20) && ((0x80000c00U >> (BRANCHING & 0x1fU) & 1) != 0))
                     && (iVar18 = 0, (int)local_f0 < iVar21 + local_ac)) {
                    lVar15 = 0;
                    do {
                      piVar12 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start;
                      iVar21 = *(int *)((long)piVar12 + lVar15);
                      if ((this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar21] == -1) {
                        if (BRANCHING == 0x1f) {
                          iVar23._M_current =
                               (this->packing_vtcs).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                          ppiVar14 = local_40;
                          pvVar26 = local_80;
                          if (iVar23._M_current ==
                              (this->packing_vtcs).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_0011205f:
                            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                      (pvVar26,iVar23,(int *)((long)piVar12 + lVar15));
                            goto LAB_00112067;
                          }
                        }
                        else {
                          iVar23._M_current =
                               (this->b_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish;
                          ppiVar14 = local_38;
                          pvVar26 = local_78;
                          if (iVar23._M_current ==
                              (this->b_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage) goto LAB_0011205f;
                        }
                        *iVar23._M_current = iVar21;
                        *ppiVar14 = iVar23._M_current + 1;
                      }
LAB_00112067:
                      lVar15 = lVar15 + 4;
                    } while (uVar28 * 4 != lVar15);
                  }
                }
                if ((int)local_c0 <= (int)local_f0) goto LAB_00112179;
              }
              else {
LAB_00112179:
                iVar18 = 0;
              }
            } while ((iVar18 == 0) && (piVar29 = piVar29 + 1, piVar29 != local_c8));
          }
        }
      }
      else {
        iVar21 = (this->used).uid;
        (this->used).uid = iVar21 + 1;
        if (iVar21 < -1) {
          piVar12 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar15 = (long)(this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar12;
          if (lVar15 != 0) {
            uVar28 = 0;
            do {
              piVar12[uVar28] = 0;
              uVar28 = uVar28 + 1;
            } while ((uVar28 & 0xffffffff) < (ulong)(lVar15 >> 2));
          }
          (this->used).uid = 1;
        }
        piVar12 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar3 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar4 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar28 = 1;
        if (1 < iVar18) {
          uVar28 = local_d0 & 0xffffffff;
        }
        uVar22 = 0;
        do {
          piVar4[piVar12[uVar22]] = (this->used).uid;
          piVar3[piVar12[uVar22]] = -1;
          uVar22 = uVar22 + 1;
        } while (uVar28 != uVar22);
        piVar12 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pvVar17 = (this->adj).
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        piVar3 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar22 = 1;
        if (1 < iVar18) {
          uVar22 = local_d0 & 0xffffffff;
        }
        uVar25 = 0;
        do {
          iVar21 = piVar12[uVar25];
          piVar29 = pvVar17[iVar21].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar16 = *(pointer *)
                     ((long)&pvVar17[iVar21].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + 8);
          if (piVar29 != piVar16) {
            piVar4 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar5 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            do {
              iVar21 = *piVar29;
              if (piVar3[iVar21] < 0) {
                iVar24 = (this->used).uid;
                iVar19 = 1;
                iVar1 = piVar5[iVar21];
                piVar5[iVar21] = iVar24;
                if (iVar1 == iVar24) {
                  iVar19 = piVar4[iVar21];
                  if (iVar19 < 0) goto LAB_001122ce;
                  iVar19 = iVar19 + 1;
                }
                piVar4[iVar21] = iVar19;
              }
              piVar29 = piVar29 + 1;
            } while (piVar29 != piVar16);
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar22);
        local_c8 = (int *)0x1;
        if (1 < iVar18) {
          local_c8 = (int *)(local_d0 & 0xffffffff);
        }
        piVar29 = (int *)0x0;
        pvVar20 = local_e8;
        local_c0 = uVar28;
        do {
          pvVar17 = (this->adj).
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          iVar18 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)piVar29];
          piVar6 = *(pointer *)
                    ((long)&pvVar17[iVar18].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data + 8);
          for (piVar16 = pvVar17[iVar18].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start; uVar28 = local_c0, piVar16 != piVar6;
              piVar16 = piVar16 + 1) {
            iVar18 = *piVar16;
            piVar12 = (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            if ((piVar12[iVar18] < 0) &&
               ((this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar18] == 1)) {
              _Var11._M_current =
                   (this->que).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
              *_Var11._M_current = 1;
              pvVar17 = (this->adj).
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              piVar13 = pvVar17[iVar18].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              piVar7 = *(pointer *)
                        ((long)&pvVar17[iVar18].super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data + 8);
              if (piVar13 == piVar7) {
                lVar15 = 1;
              }
              else {
                piVar3 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                iVar18 = 1;
                do {
                  iVar21 = *piVar13;
                  if ((piVar12[iVar21] < 0) && (piVar3[iVar21] != (this->used).uid)) {
                    lVar15 = (long)iVar18;
                    iVar18 = iVar18 + 1;
                    _Var11._M_current[lVar15] = iVar21;
                  }
                  piVar13 = piVar13 + 1;
                } while (piVar13 != piVar7);
                lVar15 = (long)iVar18;
              }
              std::vector<int,std::allocator<int>>::
              vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                        ((vector<int,std::allocator<int>> *)&local_a0,_Var11,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                         (_Var11._M_current + lVar15),(allocator_type *)&local_f4);
              std::
              vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
              ::emplace_back<std::vector<int,std::allocator<int>>>
                        (local_68,(vector<int,_std::allocator<int>_> *)&local_a0);
              if (USE_DEPENDENCY_CHECKING == true) {
                pvVar17 = (this->packing).
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                local_f4 = (int)((ulong)((long)pvVar17 -
                                        (long)(this->packing).
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                           -0x55555555 + -1;
                piVar12 = pvVar17[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (4 < (ulong)((long)pvVar17[-1].super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)piVar12)) {
                  uVar28 = 1;
                  do {
                    pvVar26 = (vector<int,std::allocator<int>> *)
                              ((this->packingMap).
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + piVar12[uVar28]);
                    iVar23._M_current = *(int **)(pvVar26 + 8);
                    if (iVar23._M_current == *(int **)(pvVar26 + 0x10)) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                (pvVar26,iVar23,&local_f4);
                    }
                    else {
                      *iVar23._M_current = local_f4;
                      *(int **)(pvVar26 + 8) = iVar23._M_current + 1;
                    }
                    uVar28 = uVar28 + 1;
                    piVar12 = pvVar17[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
                  } while (uVar28 < (ulong)((long)pvVar17[-1].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                            (long)piVar12 >> 2));
                }
                std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                _M_emplace_unique<int&>(local_70,&local_f4);
                pvVar20 = local_e8;
              }
              if (local_a0._M_dataplus._M_p != (pointer)0x0) {
                operator_delete(local_a0._M_dataplus._M_p,
                                local_a0.field_2._M_allocated_capacity -
                                (long)local_a0._M_dataplus._M_p);
              }
            }
          }
          piVar29 = (int *)((long)piVar29 + 1);
        } while (piVar29 != local_c8);
        uVar22 = 0;
        do {
          iVar18 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar22];
          if ((long)iVar18 == 1) goto LAB_001122ce;
          if (-1 < (local_e8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[iVar18]) {
            __assert_fail("x[S[j]] < 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                          ,0x91e,"int branch_and_reduce_algorithm::packingReduction()");
          }
          set(this,iVar18,0);
          uVar22 = uVar22 + 1;
        } while (uVar28 != uVar22);
      }
      piVar29 = local_48;
      if ((((uint)BRANCHING < 0x20) && ((0x80000c00U >> (BRANCHING & 0x1fU) & 1) != 0)) &&
         (1 < (int)local_d0 && (uint)local_d8 == (int)local_f0 + -1)) {
        lVar15 = (local_d0 & 0xffffffff) << 2;
        lVar30 = 0;
        if (BRANCHING == 0x1f) {
          do {
            piVar16 = (int *)((long)(this->level).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar30);
            iVar23._M_current =
                 (this->packing_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar23._M_current ==
                (this->packing_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_80,iVar23,piVar16);
            }
            else {
              *iVar23._M_current = *piVar16;
              (this->packing_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar23._M_current + 1;
            }
            lVar30 = lVar30 + 4;
          } while (lVar15 != lVar30);
        }
        else {
          do {
            piVar16 = (int *)((long)(this->level).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar30);
            iVar23._M_current =
                 (this->b_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar23._M_current ==
                (this->b_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_78,iVar23,piVar16);
            }
            else {
              *iVar23._M_current = *piVar16;
              (this->b_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar23._M_current + 1;
            }
            lVar30 = lVar30 + 4;
          } while (lVar15 != lVar30);
        }
      }
      local_dc = local_dc + 1;
      uVar28 = (ulong)local_dc;
      pvVar17 = (this->packing).
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar22 = ((long)(this->packing).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar17 >> 3) *
               -0x5555555555555555;
      iVar18 = local_a4;
    } while (uVar28 <= uVar22 && uVar22 - uVar28 != 0);
  }
  iVar18 = local_a8;
  if (((2 < debug) && (this->depth <= this->maxDepth)) && (local_a8 != this->rn)) {
    debugString_abi_cxx11_(&local_a0,this);
    packingReduction();
  }
  uVar10 = (uint)(iVar18 != *piVar29);
LAB_001122d3:
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return uVar10;
}

Assistant:

int branch_and_reduce_algorithm::packingReduction()
{
    int oldn = rn;
#if 1
    std::vector<int> x2(x);
    int a = -1;
    for (unsigned int pi = 0; pi < packing.size(); ++pi)
    {
        std::vector<int> &ps = packing[pi];
        if (a != rn)
        {
            for (int j = 0; j < N; j++)
                x2[j] = x[j];
            for (int j = modifiedN - 1; j >= 0; j--)
            {
                modifieds[j]->reverse(x2);
            }
            a = rn;
        }
        int max = ps.size() - 1 - ps[0], sum = 0, size = 0;
        std::vector<int> &S = level;
        for (unsigned int j = 1; j < ps.size(); j++)
        {
            int v = ps[j];
            assert(!USE_DEPENDENCY_CHECKING || std::find(packingMap[v].begin(), packingMap[v].end(), pi) != packingMap[v].end());
            if (x2[v] < 0)
                S[size++] = v;
            if (x2[v] == 1)
                sum++;
        }
        if (sum > max) // constraint not fulfilled => prune branch
        {
            return -1;
        }
        else if (sum == max && size > 0) // set x[v] = 0 for remaining vert.
        {
            std::vector<int> &count = iter;
            used.clear();
            for (int j = 0; j < size; j++)
            {
                used.add(S[j]);
                count[S[j]] = -1;
            }
            for (int j = 0; j < size; j++) // check if there are adjacent vtcs among remaining vtcs.
            {
                for (int u : adj[S[j]])
                    if (x[u] < 0)
                    {
                        if (used.add(u))
                        {
                            count[u] = 1;
                        }
                        else if (count[u] < 0) // adjacent vtcs => one of them has to be in the vc => prune
                        {
                            return -1;
                        }
                        else
                        {
                            count[u]++;
                        }
                    }
            }
            for (int j = 0; j < size; j++) // create new constraints
            {
                for (int u : adj[S[j]])
                    if (x[u] < 0 && count[u] == 1)
                    {
                        std::vector<int> &tmp = que;
                        int p = 0;
                        tmp[p++] = 1;
                        for (int w : adj[u])
                            if (x[w] < 0 && !used.get(w))
                            {
                                tmp[p++] = w;
                            }
                        std::vector<int> copyOfTmp(tmp.begin(), tmp.begin() + p);
                        pushPacking(copyOfTmp);
                    }
            }
            for (int j = 0; j < size; j++) // set x[v] = 0 for remaining vtcs
            {
                if (S[j] == 1)
                    return -1;
                assert(x[S[j]] < 0);
                set(S[j], 0);
            }
        }
        else if (sum + size > max) // at least one of the remaining vtcs has to be excluded
        {
            assert(size >= 2);
            std::vector<int> &count = iter;
            used.clear();
            for (int j = 0; j < size; j++)
            {
                used.add(S[j]);
                count[S[j]] = -1;
            }
            for (int v : adj[S[0]])
                if (x[v] < 0 && !used.get(v))
                {
                    int p = 0; // number of Neighbours in S[-]
                    for (int u : adj[v])
                        if (used.get(u))
                        {
                            p++;
                            count[u] = 1;
                        }
                    if (sum + p > max) // sum + p > max => v has to be in the vc
                    {
                        std::vector<int> &qs = que;
                        int q = 0;
                        qs[q++] = 2;
                        for (int u : adj[v])
                            if (x[u] < 0)
                                qs[q++] = u;
                        std::vector<int> copyOfqs(qs.begin(), qs.begin() + q);
                        pushPacking(copyOfqs);
                        set(v, 1);
                        break;
                    }
                    else if (BRANCHING == 10 || BRANCHING == 11 || BRANCHING == 31)
                    {
                        if ((sum + 1 + p) > max)
                        {
                            for (int i = 0; i < size; i++)
                                if (count[S[i]] == -1) {
                                    if (BRANCHING == 31) packing_vtcs.push_back(S[i]);
                                    else b_vtcs.push_back(S[i]);
                                }
                        }
                    }
                }
        }

        if (BRANCHING == 10 || BRANCHING == 11 | BRANCHING == 31)
        {
            if (sum == (max - 1) && size > 1)
            {
                if (BRANCHING == 31) {
                    for (int i = 0; i < size; i++) {
                        packing_vtcs.push_back(S[i]);
                    }
                } else {
                    for (int i = 0; i < size; i++) {
                        b_vtcs.push_back(S[i]);
                    }
                }
            }
        }
    }
    if (debug >= 3 && depth <= maxDepth && oldn != rn)
        fprintf(stderr, "%spacking: %d -> %d\n", debugString().c_str(), oldn, rn);
#endif // 0
    return oldn != rn ? 1 : 0;
}